

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O3

void pnga_step_max(Integer g_a,Integer g_b,void *retval)

{
  Integer btype;
  Integer atype;
  Integer bhi [7];
  Integer blo [7];
  Integer ahi [7];
  Integer alo [7];
  long local_138;
  Integer local_130;
  Integer local_128;
  Integer local_120;
  Integer local_118 [7];
  Integer aIStack_e0 [9];
  Integer local_98 [7];
  Integer aIStack_60 [8];
  
  pnga_inquire(g_a,&local_120,&local_130,local_98);
  pnga_inquire(g_b,&local_128,&local_138,local_118);
  if (local_130 != 0) {
    do {
      aIStack_e0[local_138] = 1;
      local_138 = local_138 + -1;
      aIStack_60[local_130] = 1;
      local_130 = local_130 + -1;
    } while (local_130 != 0);
    local_130 = 0;
  }
  pnga_step_max_patch(g_a,aIStack_60 + 1,local_98,g_b,aIStack_e0 + 1,local_118,retval);
  return;
}

Assistant:

void pnga_step_max(Integer g_a, Integer g_b, void *retval)
{
   Integer atype, andim;
   Integer btype, bndim;
   Integer alo[MAXDIM],ahi[MAXDIM];
   Integer blo[MAXDIM],bhi[MAXDIM];
 
    pnga_inquire(g_a,  &atype, &andim, ahi);
    pnga_inquire(g_b,  &btype, &bndim, bhi);
    while(andim){
        alo[andim-1]=1;
        andim--;
        blo[bndim-1]=1;
        bndim--;
    }
    
#if 0
    pnga_step_max_patch(g_a, alo, ahi, g_b, blo, bhi, retval, OP_STEPMAX);
#else
    pnga_step_max_patch(g_a, alo, ahi, g_b, blo, bhi, retval);
#endif
}